

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.h
# Opt level: O0

void __thiscall
xlib::Log::Format<int,int,int>(Log *this,string *format,int *first,int *rest,int *rest_1)

{
  ulong uVar1;
  string local_1e0 [48];
  ostringstream local_1b0 [8];
  ostringstream oss;
  size_t index;
  int *rest_local_1;
  int *rest_local;
  int *first_local;
  string *format_local;
  Log *this_local;
  
  uVar1 = std::__cxx11::string::find_first_of((char *)format,0x13b2c6);
  if (uVar1 != 0xffffffffffffffff) {
    std::__cxx11::ostringstream::ostringstream(local_1b0);
    std::ostream::operator<<((ostream *)local_1b0,*first);
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::replace((ulong)format,uVar1,(string *)0x2);
    std::__cxx11::string::~string(local_1e0);
    Format<int,int>(this,format,rest,rest_1);
    std::__cxx11::ostringstream::~ostringstream(local_1b0);
  }
  return;
}

Assistant:

void Format(std::string* format,  const First& first, const Rest&... rest) {
        size_t index = format->find_first_of("%v");
        if (index == std::string::npos) {
            return;
        }
        std::ostringstream oss;
        oss << first;
        format->replace(index, 2, oss.str());
        Format(format, rest...);
    }